

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyHaig.c
# Opt level: O3

void Ivy_ManHaigSimulate(Ivy_Man_t *p)

{
  byte *pbVar1;
  Ivy_Man_t *p_00;
  void *pvVar2;
  Ivy_Init_t IVar3;
  Ivy_Init_t IVar4;
  uint uVar5;
  Vec_Int_t *__ptr;
  long lVar6;
  ulong uVar7;
  Vec_Ptr_t *pVVar8;
  ulong uVar9;
  int iVar10;
  uint uVar11;
  ulong uVar12;
  ulong uVar13;
  void *pvVar14;
  Vec_Int_t *vLatches;
  Vec_Int_t *local_38;
  
  Ivy_ManCheckChoices(p);
  p_00 = p->pHaig;
  if (p_00 == (Ivy_Man_t *)0x0) {
    __assert_fail("p->pHaig != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/ivy/ivyHaig.c"
                  ,0x1c4,"void Ivy_ManHaigSimulate(Ivy_Man_t *)");
  }
  __ptr = Ivy_ManDfsSeq(p_00,&local_38);
  *(uint *)&p_00->pConst1->field_0x8 = *(uint *)&p_00->pConst1->field_0x8 & 0xfffff9ff | 0x400;
  pVVar8 = p_00->vPis;
  if (0 < pVVar8->nSize) {
    lVar6 = 0;
    do {
      *(uint *)((long)pVVar8->pArray[lVar6] + 8) =
           *(uint *)((long)pVVar8->pArray[lVar6] + 8) & 0xfffff9ff | 0x200;
      lVar6 = lVar6 + 1;
      pVVar8 = p_00->vPis;
    } while (lVar6 < pVVar8->nSize);
  }
  uVar7 = (ulong)(uint)local_38->nSize;
  if (0 < local_38->nSize) {
    lVar6 = 0;
    do {
      iVar10 = local_38->pArray[lVar6];
      if (((long)iVar10 < 0) || (p_00->vObjs->nSize <= iVar10)) goto LAB_007a7603;
      pvVar2 = p_00->vObjs->pArray[iVar10];
      if (pvVar2 == (void *)0x0) break;
      pbVar1 = (byte *)((long)pvVar2 + 9);
      *pbVar1 = *pbVar1 | 6;
      lVar6 = lVar6 + 1;
      uVar7 = (ulong)local_38->nSize;
    } while (lVar6 < (long)uVar7);
  }
  pvVar2 = p_00->pData;
  if (0 < *(int *)((long)pvVar2 + 4)) {
    lVar6 = 0;
    do {
      iVar10 = *(int *)(*(long *)((long)pvVar2 + 8) + lVar6 * 4);
      if (((long)iVar10 < 0) || (p_00->vObjs->nSize <= iVar10)) {
LAB_007a7603:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      pvVar14 = p_00->vObjs->pArray[iVar10];
      if (pvVar14 == (void *)0x0) break;
      *(uint *)((long)pvVar14 + 8) = *(uint *)((long)pvVar14 + 8) & 0xfffff9ff | 0x200;
      lVar6 = lVar6 + 1;
    } while (lVar6 < *(int *)((long)pvVar2 + 4));
    uVar7 = (ulong)(uint)local_38->nSize;
  }
  uVar12 = 0;
  do {
    uVar9 = 0;
    if (0 < (int)uVar7) {
      uVar13 = 0;
      uVar9 = 0;
      do {
        iVar10 = local_38->pArray[uVar13];
        if (((long)iVar10 < 0) || (p_00->vObjs->nSize <= iVar10)) goto LAB_007a7603;
        pvVar2 = p_00->vObjs->pArray[iVar10];
        if (pvVar2 == (void *)0x0) break;
        uVar9 = (ulong)((int)uVar9 + (uint)((~*(uint *)((long)pvVar2 + 8) & 0x600) == 0));
        uVar13 = uVar13 + 1;
      } while ((uVar7 & 0xffffffff) != uVar13);
    }
    printf("Iter %d : Non-determinate = %d\n",uVar12,uVar9);
    if (0 < __ptr->nSize) {
      lVar6 = 0;
      do {
        iVar10 = __ptr->pArray[lVar6];
        if (((long)iVar10 < 0) || (p_00->vObjs->nSize <= iVar10)) goto LAB_007a7603;
        pvVar2 = p_00->vObjs->pArray[iVar10];
        if (pvVar2 == (void *)0x0) break;
        IVar3 = Ivy_InitNotCond(*(uint *)((*(ulong *)((long)pvVar2 + 0x10) & 0xfffffffffffffffe) + 8
                                         ) >> 9 & IVY_INIT_DC,
                                (uint)*(ulong *)((long)pvVar2 + 0x10) & 1);
        IVar4 = Ivy_InitNotCond(*(uint *)((*(ulong *)((long)pvVar2 + 0x18) & 0xfffffffffffffffe) + 8
                                         ) >> 9 & IVY_INIT_DC,
                                (uint)*(ulong *)((long)pvVar2 + 0x18) & 1);
        uVar11 = (uint)(IVar4 == IVY_INIT_1 && IVar3 == IVY_INIT_1) * 0x200 + 0x200;
        if (IVar4 == IVY_INIT_DC) {
          uVar11 = 0x600;
        }
        uVar7 = (ulong)uVar11;
        if (IVar3 == IVY_INIT_DC) {
          uVar7 = 0x600;
        }
        uVar5 = *(uint *)((long)pvVar2 + 8) & 0xfffff9ff;
        uVar11 = (uint)uVar7;
        *(uint *)((long)pvVar2 + 8) = uVar11 + uVar5;
        pvVar14 = *(void **)((long)pvVar2 + 0x48);
        if ((pvVar14 != (void *)0x0) && (0 < *(int *)((long)pvVar2 + 0xc))) {
          if (((ulong)pvVar14 & 1) != 0) {
            __assert_fail("!Ivy_IsComplement(pObj->pEquiv)",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/ivy/ivyHaig.c"
                          ,0x1f6,"void Ivy_ManHaigSimulate(Ivy_Man_t *)");
          }
          if (pvVar14 != pvVar2) {
            uVar7 = uVar7 >> 9;
            do {
              IVar3 = Ivy_InitNotCond(*(uint *)((long)pvVar14 + 8) >> 9 & IVY_INIT_DC,
                                      *(uint *)((long)pvVar14 + 0x48) & 1);
              iVar10 = (int)uVar7;
              if ((IVar3 == IVY_INIT_1 && iVar10 == 1) || (IVar3 == IVY_INIT_0 && iVar10 == 2)) {
                puts("Compatibility fails.");
                uVar7 = 1;
              }
              else if (iVar10 == 3) {
                uVar7 = (ulong)IVar3;
              }
              pvVar14 = (void *)(*(ulong *)((long)pvVar14 + 0x48) & 0xfffffffffffffffe);
            } while (pvVar2 != pvVar14);
            uVar11 = ((uint)uVar7 & 3) << 9;
            uVar5 = *(uint *)((long)pvVar2 + 8) & 0xfffff9ff;
          }
          *(uint *)((long)pvVar2 + 8) = uVar5 | uVar11;
        }
        lVar6 = lVar6 + 1;
      } while (lVar6 < __ptr->nSize);
    }
    uVar7 = (ulong)(uint)local_38->nSize;
    if (0 < local_38->nSize) {
      lVar6 = 0;
      do {
        iVar10 = local_38->pArray[lVar6];
        if (((long)iVar10 < 0) || (p_00->vObjs->nSize <= iVar10)) goto LAB_007a7603;
        pvVar2 = p_00->vObjs->pArray[iVar10];
        if (pvVar2 == (void *)0x0) break;
        *(uint *)((long)pvVar2 + 8) =
             (*(uint *)((long)pvVar2 + 8) & 0x7ff) +
             (*(uint *)((*(ulong *)((long)pvVar2 + 0x10) & 0xfffffffffffffffe) + 8) & 0x600) * 4;
        lVar6 = lVar6 + 1;
        uVar7 = (ulong)local_38->nSize;
      } while (lVar6 < (long)uVar7);
      if (0 < (int)uVar7) {
        lVar6 = 0;
        do {
          iVar10 = local_38->pArray[lVar6];
          if (((long)iVar10 < 0) || (p_00->vObjs->nSize <= iVar10)) goto LAB_007a7603;
          pvVar2 = p_00->vObjs->pArray[iVar10];
          if (pvVar2 == (void *)0x0) break;
          *(uint *)((long)pvVar2 + 8) =
               *(uint *)((long)pvVar2 + 8) & 0x1ff | *(uint *)((long)pvVar2 + 8) >> 2 & 0x600;
          lVar6 = lVar6 + 1;
          uVar7 = (ulong)local_38->nSize;
        } while (lVar6 < (long)uVar7);
      }
    }
    uVar11 = (int)uVar12 + 1;
    uVar12 = (ulong)uVar11;
    if (uVar11 == 10) {
      if (__ptr->pArray != (int *)0x0) {
        free(__ptr->pArray);
      }
      free(__ptr);
      if (local_38->pArray != (int *)0x0) {
        free(local_38->pArray);
      }
      free(local_38);
      return;
    }
  } while( true );
}

Assistant:

void Ivy_ManHaigSimulate( Ivy_Man_t * p )
{
    Vec_Int_t * vNodes, * vLatches, * vLatchesD;
    Ivy_Obj_t * pObj, * pTemp;
    Ivy_Init_t In0, In1;
    int i, k, Counter;
    int fVerbose = 0;

    // check choices
    Ivy_ManCheckChoices( p );

    // switch to HAIG
    assert( p->pHaig != NULL );
    p = p->pHaig;

if ( fVerbose )
Ivy_ManForEachPi( p, pObj, i )
printf( "Setting PI %d\n", pObj->Id );

    // collect latches and nodes in the DFS order
    vNodes = Ivy_ManDfsSeq( p, &vLatches );

if ( fVerbose )
Ivy_ManForEachNodeVec( p, vNodes, pObj, i )
printf( "Collected node %d with fanins %d and %d\n", pObj->Id, Ivy_ObjFanin0(pObj)->Id, Ivy_ObjFanin1(pObj)->Id );

    // set the PI values
    Ivy_ManConst1(p)->Init = IVY_INIT_1;
    Ivy_ManForEachPi( p, pObj, i )
        pObj->Init = IVY_INIT_0;

    // set the latch values
    Ivy_ManForEachNodeVec( p, vLatches, pObj, i )
        pObj->Init = IVY_INIT_DC;
    // set the latches of D to be determinate
    vLatchesD = (Vec_Int_t *)p->pData;
    Ivy_ManForEachNodeVec( p, vLatchesD, pObj, i )
        pObj->Init = IVY_INIT_0;

    // perform several rounds of simulation
    for ( k = 0; k < 10; k++ )
    {
        // count the number of non-determinate values
        Counter = 0;
        Ivy_ManForEachNodeVec( p, vLatches, pObj, i )
            Counter += ( pObj->Init == IVY_INIT_DC );
        printf( "Iter %d : Non-determinate = %d\n", k, Counter );    
        
        // simulate the internal nodes
        Ivy_ManForEachNodeVec( p, vNodes, pObj, i )
        {
if ( fVerbose )
printf( "Processing node %d with fanins %d and %d\n", pObj->Id, Ivy_ObjFanin0(pObj)->Id, Ivy_ObjFanin1(pObj)->Id );
            In0 = Ivy_InitNotCond( (Ivy_Init_t)Ivy_ObjFanin0(pObj)->Init, Ivy_ObjFaninC0(pObj) );
            In1 = Ivy_InitNotCond( (Ivy_Init_t)Ivy_ObjFanin1(pObj)->Init, Ivy_ObjFaninC1(pObj) );
            pObj->Init = Ivy_ManHaigSimulateAnd( In0, In1 );
            // simulate the equivalence class if the node is a representative
            if ( pObj->pEquiv && Ivy_ObjRefs(pObj) > 0 )
            {
if ( fVerbose )
printf( "Processing choice node %d\n", pObj->Id );
                In0 = (Ivy_Init_t)pObj->Init;
                assert( !Ivy_IsComplement(pObj->pEquiv) );
                for ( pTemp = pObj->pEquiv; pTemp != pObj; pTemp = Ivy_Regular(pTemp->pEquiv) )
                {
if ( fVerbose )
printf( "Processing secondary node %d\n", pTemp->Id );
                    In1 = Ivy_InitNotCond( (Ivy_Init_t)pTemp->Init, Ivy_IsComplement(pTemp->pEquiv) );
                    In0 = Ivy_ManHaigSimulateChoice( In0, In1 );
                }
                pObj->Init = In0;
            }
        }

        // simulate the latches
        Ivy_ManForEachNodeVec( p, vLatches, pObj, i )
        {
            pObj->Level = Ivy_ObjFanin0(pObj)->Init;
if ( fVerbose )
printf( "Using latch %d with fanin %d\n", pObj->Id, Ivy_ObjFanin0(pObj)->Id );
        }
        Ivy_ManForEachNodeVec( p, vLatches, pObj, i )
            pObj->Init = pObj->Level, pObj->Level = 0;
    }
    // free arrays
    Vec_IntFree( vNodes );
    Vec_IntFree( vLatches );
}